

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O0

void stl_(double *y,int *n,int *np,int *ns,int *nt,int *nl,int *isdeg,int *itdeg,int *ildeg,
         int *nsjump,int *ntjump,int *nljump,int *ni,int *no,double *rw,double *season,double *trend
         ,double *work)

{
  int iVar1;
  int local_88;
  int local_84;
  int userw;
  int newnt;
  int newns;
  int newnp;
  int newnl;
  int k;
  int i__;
  int i__1;
  int work_offset;
  int work_dim1;
  int *nl_local;
  int *nt_local;
  int *ns_local;
  int *np_local;
  int *n_local;
  double *y_local;
  
  n_local = (int *)(y + -1);
  i__1 = *n + *np * 2;
  iVar1 = i__1 + 1;
  local_88 = 0;
  k = *n;
  for (newnl = 1; newnl <= k; newnl = newnl + 1) {
    trend[(long)newnl + -1] = 0.0;
  }
  i__ = iVar1;
  _work_offset = nl;
  nl_local = nt;
  nt_local = ns;
  ns_local = np;
  np_local = n;
  userw = imax(3,*ns);
  local_84 = imax(3,*nl_local);
  newns = imax(3,*_work_offset);
  if (userw % 2 == 0) {
    userw = userw + 1;
  }
  if (local_84 % 2 == 0) {
    local_84 = local_84 + 1;
  }
  if (newns % 2 == 0) {
    newns = newns + 1;
  }
  newnt = imax(2,*ns_local);
  newnp = 0;
  while( true ) {
    stlstp_((double *)(n_local + 2),np_local,&newnt,&userw,&local_84,&newns,isdeg,itdeg,ildeg,nsjump
            ,ntjump,nljump,ni,&local_88,rw,season,trend,work + ((long)i__ - (long)iVar1));
    newnp = newnp + 1;
    if (*no < newnp) break;
    k = *np_local;
    for (newnl = 1; newnl <= k; newnl = newnl + 1) {
      work[(long)(newnl + i__1) - (long)iVar1] = trend[(long)newnl + -1] + season[(long)newnl + -1];
    }
    stlrwt_((double *)(n_local + 2),np_local,work + ((long)(i__1 + 1) - (long)iVar1),rw);
    local_88 = 1;
  }
  if (*no < 1) {
    iVar1 = *np_local;
    for (newnl = 1; newnl <= iVar1; newnl = newnl + 1) {
      rw[(long)newnl + -1] = 1.0;
    }
  }
  return;
}

Assistant:

void stl_(double *y, int *n, int *np, int *ns, int *nt, int *nl, int *isdeg, int *itdeg, int *
	ildeg, int *nsjump, int *ntjump, int *nljump, int *ni, int *no, double *rw, double *season, double *trend, 
	double *work)
{
    /* System generated locals */
    int work_dim1, work_offset, i__1;

    /* Local variables */
    int i__, k, newnl, newnp, newns, newnt;
	int userw;

/* Arg */
/* 	n                   : length(y) */
/* 	ns, nt, nl          : spans        for `s', `t' and `l' smoother */
/* 	isdeg, itdeg, ildeg : local degree for `s', `t' and `l' smoother */
/* 	nsjump,ntjump,nljump: ........     for `s', `t' and `l' smoother */
/*       ni, no              : number of inner and outer (robust) iterations */
/* Var */
    /* Parameter adjustments */
    --trend;
    --season;
    --rw;
    --y;
    work_dim1 = *n + 2 * *np;
    work_offset = 1 + work_dim1;
    work -= work_offset;

    /* Function Body */
    userw = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	trend[i__] = 0.0;
/* L1: */
    }
/* the three spans must be at least three and odd: */
    newns = imax(3,*ns);
    newnt = imax(3,*nt);
    newnl = imax(3,*nl);
    if (newns % 2 == 0) {
	++newns;
    }
    if (newnt % 2 == 0) {
	++newnt;
    }
    if (newnl % 2 == 0) {
	++newnl;
    }
/* periodicity at least 2: */
    newnp = imax(2,*np);
    k = 0;
/* --- outer loop -- robustnes iterations */
L100:
    stlstp_(&y[1], n, &newnp, &newns, &newnt, &newnl, isdeg, itdeg, ildeg, 
	    nsjump, ntjump, nljump, ni, &userw, &rw[1], &season[1], &trend[1],
	     &work[work_offset]);
    ++k;
    if (k > *no) {
	goto L10;
    }
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	work[i__ + work_dim1] = trend[i__] + season[i__];
/* L3: */
    }
    stlrwt_(&y[1], n, &work[work_dim1 + 1], &rw[1]);
    userw = 1;
    goto L100;
/* --- end Loop */
L10:
/*     robustness weights when there were no robustness iterations: */
    if (*no <= 0) {
	i__1 = *n;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    rw[i__] = 1.0;
/* L15: */
	}
    }
}